

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

void rw::xbox::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *this;
  uint32 uVar1;
  uint uVar2;
  uint8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  uVar1 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar1 - 0xc);
  Stream::writeU32(stream,5);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  this = tex->raster;
  lVar8 = (long)nativeRasterOffset;
  uVar2 = Raster::getNumLevels(this);
  Stream::writeI32(stream,this->format);
  Stream::writeI16(stream,(ushort)*(byte *)((long)&this->height + lVar8));
  Stream::writeI16(stream,*(int16 *)((long)&this->depth + lVar8));
  Stream::writeU16(stream,(uint16)this->width);
  Stream::writeU16(stream,(uint16)this->height);
  Stream::writeU8(stream,(uint8)this->depth);
  Stream::writeU8(stream,(uint8)uVar2);
  Stream::writeU8(stream,(uint8)this->type);
  Stream::writeU8(stream,*(uint8 *)((long)&this->format + lVar8));
  uVar4 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar4;
  }
  iVar6 = 0;
  for (; uVar7 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    iVar6 = iVar6 + *(int *)(*(long *)((long)&tex->raster->platform + (long)nativeRasterOffset) +
                             0x10 + uVar4);
  }
  uVar2 = iVar6 + 3U & 0xfffffffc;
  Stream::writeI32(stream,uVar2);
  uVar5 = 0x80;
  if ((((uint)this->format >> 0xe & 1) != 0) ||
     (uVar5 = 0x400, ((uint)this->format >> 0xd & 1) != 0)) {
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + lVar8),uVar5);
  }
  puVar3 = Raster::lock(this,0,2);
  (*stream->_vptr_Stream[3])(stream,puVar3,(ulong)uVar2);
  Raster::unlock(this,0);
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_XBOX);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	Raster *raster = tex->raster;
	XboxRaster *ras = GETXBOXRASTEREXT(raster);
	int32 numLevels = raster->getNumLevels();
	stream->writeI32(raster->format);
	stream->writeI16(ras->hasAlpha);
	stream->writeI16(ras->unknownFlag);
	stream->writeU16(raster->width);
	stream->writeU16(raster->height);
	stream->writeU8(raster->depth);
	stream->writeU8(numLevels);
	stream->writeU8(raster->type);
	stream->writeU8(ras->format);

	int32 totalSize = 0;
	for(int32 i = 0; i < numLevels; i++)
		totalSize += getLevelSize(tex->raster, i);
	totalSize = (totalSize+3)&~3;
	stream->writeI32(totalSize);

	if(raster->format & Raster::PAL4)
		stream->write8(ras->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->write8(ras->palette, 4*256);

	// exploit the fact that mipmaps are allocated consecutively
	uint8 *data = raster->lock(0, Raster::LOCKREAD);
	stream->write8(data, totalSize);
	raster->unlock(0);
}